

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

int __thiscall axl::io::MappedFile::open(MappedFile *this,char *__file,int __oflag,...)

{
  uint uVar1;
  MappedFile *pMVar2;
  bool bVar3;
  bool result;
  
  close(this,(int)__file);
  uVar1 = File::open(&this->m_file,__file,__oflag);
  pMVar2 = (MappedFile *)((ulong)uVar1 & 0xffffffffffffff01);
  bVar3 = (char)pMVar2 != '\0';
  if (bVar3) {
    this->m_fileFlags = __oflag;
    pMVar2 = this;
  }
  return (int)CONCAT71((int7)((ulong)pMVar2 >> 8),bVar3);
}

Assistant:

bool
MappedFile::open(
	const sl::StringRef& fileName,
	uint_t flags
) {
	close();

	bool result = m_file.open(fileName, flags);
	if (!result)
		return false;

	m_fileFlags = flags;
	return true;
}